

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O3

void Sfm_NtkDfs_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes,Vec_Wec_t *vGroups,Vec_Int_t *vGroupMap
                   ,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  Vec_Int_t *p_00;
  long lVar8;
  
  if (iNode < p->nPis) {
    return;
  }
  if ((-1 < iNode) && (iNode < (p->vTravIds).nSize)) {
    piVar2 = (p->vTravIds).pArray;
    if (piVar2[(uint)iNode] == p->nTravIds) {
      return;
    }
    if (iNode < vGroupMap->nSize) {
      if (vGroupMap->pArray[(uint)iNode] < 0) {
        piVar2[(uint)iNode] = p->nTravIds;
        if (iNode < (p->vFanins).nSize) {
          lVar7 = 0;
          do {
            pVVar3 = (p->vFanins).pArray;
            p_00 = vNodes;
            if (pVVar3[(uint)iNode].nSize <= lVar7) goto LAB_00537954;
            Sfm_NtkDfs_rec(p,pVVar3[(uint)iNode].pArray[lVar7],vNodes,vGroups,vGroupMap,vBoxesLeft);
            lVar7 = lVar7 + 1;
          } while (iNode < (p->vFanins).nSize);
        }
      }
      else {
        iNode = (uint)vGroupMap->pArray[(uint)iNode] >> 1;
        if (iNode < vGroups->nSize) {
          pVVar3 = vGroups->pArray;
          iVar1 = pVVar3[(uint)iNode].nSize;
          p_00 = vBoxesLeft;
          if (0 < (long)iVar1) {
            lVar7 = 0;
            do {
              if ((pVVar3[(uint)iNode].pArray[lVar7] < p->nPis) ||
                 (p->nObjs <= pVVar3[(uint)iNode].pArray[lVar7] + p->nPos)) {
                __assert_fail("Sfm_ObjIsNode(p, iNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmWin.c"
                              ,0x94,
                              "void Sfm_NtkDfs_rec(Sfm_Ntk_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              lVar7 = lVar7 + 1;
            } while (iVar1 != lVar7);
            if (0 < iVar1) {
              piVar4 = pVVar3[(uint)iNode].pArray;
              lVar7 = 0;
              do {
                iVar1 = piVar4[lVar7];
                if (((long)iVar1 < 0) || ((p->vTravIds).nSize <= iVar1)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                piVar2[iVar1] = p->nTravIds;
                lVar7 = lVar7 + 1;
              } while (lVar7 < pVVar3[(uint)iNode].nSize);
              if (0 < pVVar3[(uint)iNode].nSize) {
                lVar7 = 0;
                do {
                  iVar1 = pVVar3[(uint)iNode].pArray[lVar7];
                  lVar6 = (long)iVar1;
                  if ((lVar6 < 0) || ((p->vFanins).nSize <= iVar1)) goto LAB_0053792e;
                  lVar8 = 0;
                  while (pVVar5 = (p->vFanins).pArray, lVar8 < pVVar5[lVar6].nSize) {
                    Sfm_NtkDfs_rec(p,pVVar5[lVar6].pArray[lVar8],vNodes,vGroups,vGroupMap,vBoxesLeft
                                  );
                    lVar8 = lVar8 + 1;
                    if ((p->vFanins).nSize <= iVar1) goto LAB_0053792e;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < pVVar3[(uint)iNode].nSize);
                if (0 < pVVar3[(uint)iNode].nSize) {
                  lVar7 = 0;
                  do {
                    Vec_IntPush(vNodes,pVVar3[(uint)iNode].pArray[lVar7]);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < pVVar3[(uint)iNode].nSize);
                }
              }
            }
          }
LAB_00537954:
          Vec_IntPush(p_00,iNode);
          return;
        }
      }
LAB_0053792e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sfm_NtkDfs_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes, Vec_Wec_t * vGroups, Vec_Int_t * vGroupMap, Vec_Int_t * vBoxesLeft )
{
    int i, iFanin;
    if ( Sfm_ObjIsPi(p, iNode) )
        return;
    if ( Sfm_ObjIsTravIdCurrent(p, iNode) )
        return;
    if ( Vec_IntEntry(vGroupMap, iNode) >= 0 )
    {
        int k, iGroup = Abc_Lit2Var( Vec_IntEntry(vGroupMap, iNode) );
        Vec_Int_t * vGroup = Vec_WecEntry( vGroups, iGroup );
        Vec_IntForEachEntry( vGroup, iNode, i )
            assert( Sfm_ObjIsNode(p, iNode) );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjSetTravIdCurrent( p, iNode );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Vec_IntPush( vNodes, iNode );
        Vec_IntPush( vBoxesLeft, iGroup );
    }
    else
    {
        Sfm_ObjSetTravIdCurrent(p, iNode);
        Sfm_ObjForEachFanin( p, iNode, iFanin, i )
            Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntPush( vNodes, iNode );
    }
}